

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

void __thiscall
TPathFragmentTable::CopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  char *pcVar1;
  char NewItem;
  TStruct40 *pTVar2;
  bool bVar3;
  
  pTVar2 = pSearch->pStruct40;
  if ((this->PathMarks).TotalItemCount == 0) {
    if (nFragmentOffset < (this->PathFragments).ItemCount) {
      do {
        NewItem = (this->PathFragments).ItemArray[nFragmentOffset];
        if (NewItem == '\0') {
          return;
        }
        nFragmentOffset = nFragmentOffset + 1;
        TGenericArray<char>::Insert(&pTVar2->PathBuffer,NewItem);
      } while (nFragmentOffset < (this->PathFragments).ItemCount);
    }
LAB_00117542:
    __assert_fail("index < ItemCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0x1d0,"T &TGenericArray<char>::operator[](size_t) [T = char]");
  }
  bVar3 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
  if (!bVar3) {
    do {
      if ((this->PathFragments).ItemCount <= nFragmentOffset) goto LAB_00117542;
      pcVar1 = (this->PathFragments).ItemArray + nFragmentOffset;
      nFragmentOffset = nFragmentOffset + 1;
      TGenericArray<char>::Insert(&pTVar2->PathBuffer,*pcVar1);
      bVar3 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
    } while (!bVar3);
  }
  return;
}

Assistant:

void CopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if (PathMarks.IsEmpty())
        {
            // HOTS: 195A40C
            while (PathFragments[nFragmentOffset] != 0)
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
        else
        {
            // HOTS: 195A4B3
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
    }